

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

void vfio_enable_dma(int device_fd)

{
  int iVar1;
  ssize_t sVar2;
  vfio_region_info conf_reg;
  uint16_t dma;
  ushort local_208 [256];
  
  iVar1 = ioctl(device_fd,0x3b6c);
  if (iVar1 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    local_208[0] = 0;
    sVar2 = pread(device_fd,local_208,2,4);
    if (sVar2 == 2) {
      local_208[0] = local_208[0] | 4;
      sVar2 = pwrite(device_fd,local_208,2,4);
      if (sVar2 == 2) {
        return;
      }
      __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                    ,0x27,"void vfio_enable_dma(int)");
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

void vfio_enable_dma(int device_fd) {
	// write to the command register (offset 4) in the PCIe config space
	int command_register_offset = 4;
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	int bus_master_enable_bit = 2;
	// Get region info for config region
	struct vfio_region_info conf_reg = {.argsz = sizeof(conf_reg)};
	conf_reg.index = VFIO_PCI_CONFIG_REGION_INDEX;
	check_err(ioctl(device_fd, VFIO_DEVICE_GET_REGION_INFO, &conf_reg), "get vfio config region info");
	uint16_t dma = 0;
	assert(pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
	dma |= 1 << bus_master_enable_bit;
	assert(pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
}